

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

int argument(object *proc,int parBlkSize,object *currentParam)

{
  typeDesc *ptVar1;
  typeDesc *ptVar2;
  object *poVar3;
  int local_40;
  int local_3c;
  int parSize;
  int tpIndex;
  typeDesc *tp;
  typeDesc *type;
  object *obj;
  object *currentParam_local;
  int parBlkSize_local;
  object *proc_local;
  
  type = (typeDesc *)0x0;
  local_3c = 0;
  if (((currentSymbol == 0x25f) || (currentSymbol == 0x261)) || (currentSymbol == 0x26d)) {
    if (currentSymbol == 0x25f) {
      local_3c = intTypeIndex;
    }
    else if (currentSymbol == 0x261) {
      local_3c = charTypeIndex;
    }
    else if (currentSymbol == 0x26d) {
      local_3c = boolTypeIndex;
    }
    getSymbol();
    if (currentSymbol != 0x1f5) {
      mark("missing identifier");
      exit(-1);
    }
    if (proc->hasPrototype == 1) {
      stringCopy(idName,currentParam->name);
    }
    else {
      type = (typeDesc *)newObj(0x2c1);
      ((object *)type)->typeIndex = local_3c;
    }
    ptVar1 = getType(local_3c);
    local_40 = parBlkSize + ptVar1->size;
    getSymbol();
    if (currentSymbol == 0x130) {
      getSymbol();
      if (currentSymbol != 0x12f) {
        mark("missing right bracket");
        exit(-1);
      }
      if (proc->hasPrototype == 1) {
        ptVar1 = getType(currentParam->typeIndex);
        if ((ptVar1->form != 0x322) || (ptVar1->base->index != local_3c)) {
          mark("type mismatch in prototype and declaration");
          exit(-1);
        }
      }
      else {
        ptVar1 = newType();
        ptVar1->form = 0x322;
        ptVar2 = getType(local_3c);
        ptVar1->base = ptVar2;
        ptVar1->size = 0xc;
        type->len = ptVar1->index;
        type->size = 0x2c5;
      }
      local_40 = parBlkSize + 0xc;
      getSymbol();
    }
    else if ((proc->hasPrototype == 1) && (currentParam->typeIndex != local_3c)) {
      mark("type mismatch in prototype or declaration");
      exit(-1);
    }
  }
  else {
    if (currentSymbol != 0x268) {
      mark("bad argument");
      exit(-1);
    }
    getSymbol();
    if (currentSymbol != 0x1f5) {
      mark("missing identifier");
      exit(-1);
    }
    getSymbol();
    poVar3 = find();
    ptVar1 = getType(poVar3->typeIndex);
    if (currentSymbol != 99) {
      mark("bad struct variable");
      exit(-1);
    }
    getSymbol();
    if (currentSymbol != 0x1f5) {
      mark("missing variable name");
      exit(-1);
    }
    if (proc->hasPrototype == 1) {
      stringCopy(idName,currentParam->name);
      if (currentParam->typeIndex != ptVar1->refIndex) {
        mark("type mismatch in prototype/declaration");
        exit(-1);
      }
    }
    else {
      poVar3 = newObj(0x2c5);
      poVar3->typeIndex = ptVar1->refIndex;
    }
    local_40 = parBlkSize + 4;
    getSymbol();
  }
  return local_40;
}

Assistant:

procedure 
int argument(struct object *proc, int parBlkSize, struct object *currentParam)  {
	variable struct object *obj;
	variable struct typeDesc *type; variable struct typeDesc *tp;
	variable int tpIndex; variable int parSize;
	obj = NULL; tp = NULL; type = NULL; parSize = 0;tpIndex=0;
	
	if ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR) || (currentSymbol == SYMBOL_BOOL)) {
		if (currentSymbol == SYMBOL_INT){
			tpIndex = intTypeIndex;
		} elsif (currentSymbol == SYMBOL_CHAR){
			tpIndex = charTypeIndex;
		} elsif (currentSymbol == SYMBOL_BOOL) {
			tpIndex = boolTypeIndex;
		}
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) { /* int x */
			if (proc->hasPrototype == true) {
				stringCopy(idName,currentParam->name); 
			} else { 
				obj = newObj(CLASS_VAR); 
				obj->typeIndex = tpIndex;
			}
			type = getType(tpIndex);
			parSize = parBlkSize + type->size;
			getSymbol();
			if (currentSymbol == SYMBOL_LBRAK) {
				getSymbol();
				if (currentSymbol == SYMBOL_RBRAK) { /* we have an array, such as char a[] */
					if (proc->hasPrototype == true) { /* check consistency */
						type = getType(currentParam->typeIndex);
						if ((type->form != FORM_ARRAY) || (type->base->index != tpIndex))  { /* check form, base (differ) */
							mark("type mismatch in prototype and declaration");
							exit(-1);
						}
					} else {
						tp = newType();
						tp->form = FORM_ARRAY;
						type = getType(tpIndex);
						tp->base = type;
						tp->size = wordSize + 8; /* adr + len + onstack */ 
						obj->typeIndex = tp->index;
						obj->cl = CLASS_PAR; 
					}
					parSize = parBlkSize + wordSize + 8;
					getSymbol();
				} else {
					mark("missing right bracket");
					exit(-1);
				}
			} else { /* consistency type check for non-array vars */
				if (proc->hasPrototype == true) {
					if (currentParam->typeIndex != tpIndex) {
						mark("type mismatch in prototype or declaration");
						exit(-1);
					}
				}
			}
			
		} else {
			mark("missing identifier");
			exit(-1);
		}
	} elsif (currentSymbol == SYMBOL_STRUCT) { 
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			getSymbol();
			obj = find();
			type = getType(obj->typeIndex);
			if (currentSymbol == SYMBOL_MUL) {
				getSymbol();
				if (currentSymbol == SYMBOL_IDENTIFIER) {
					if (proc->hasPrototype == true) {
						stringCopy(idName,currentParam->name);
						if (currentParam->typeIndex != type->refIndex) {
							mark("type mismatch in prototype/declaration");
							exit(-1);
						}
					} else {
						obj = newObj(CLASS_PAR);
						obj->typeIndex = type->refIndex;
					}
					parSize = parBlkSize + wordSize;
					getSymbol();
				} else {
					mark("missing variable name");
					exit(-1);
				}
			} else {
				mark("bad struct variable");
				exit(-1);
			}
		} else {
			mark("missing identifier");
			exit(-1);
		}
	} else {
		mark("bad argument");
		exit(-1);
	}
	return parSize;
}